

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O2

void cmCacheManager::OutputWarningComment(ostream *fout,string *message,bool wrapSpaces)

{
  char cVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  size_type i;
  ulong uVar5;
  string oneLine;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  string local_50 [32];
  
  uVar2 = message->_M_string_length;
  local_70 = local_60;
  local_68 = 0;
  local_60[0] = 0;
  uVar4 = 0;
  for (uVar5 = 0; uVar5 <= uVar2; uVar5 = uVar5 + 1) {
    if (((uVar5 == uVar2) || (cVar1 = (message->_M_dataplus)._M_p[uVar5], cVar1 == '\n')) ||
       ((0x3b < uVar5 - uVar4 && wrapSpaces) && cVar1 == ' ')) {
      std::operator<<(fout,"# ");
      if ((message->_M_dataplus)._M_p[uVar4] == '\n') {
        std::operator<<(fout,"\\n");
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)message);
      std::__cxx11::string::operator=((string *)&local_70,local_50);
      std::__cxx11::string::~string(local_50);
      poVar3 = std::operator<<(fout,(string *)&local_70);
      std::operator<<(poVar3,"\n");
      uVar4 = uVar5;
    }
  }
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void cmCacheManager::OutputWarningComment(std::ostream& fout,
                                          std::string const& message,
                                          bool wrapSpaces)
{
  std::string::size_type end = message.size();
  std::string oneLine;
  std::string::size_type pos = 0;
  for (std::string::size_type i = 0; i <= end; i++) {
    if ((i == end) || (message[i] == '\n') ||
        ((i - pos >= 60) && (message[i] == ' ') && wrapSpaces)) {
      fout << "# ";
      if (message[pos] == '\n') {
        pos++;
        fout << "\\n";
      }
      oneLine = message.substr(pos, i - pos);
      fout << oneLine << "\n";
      pos = i;
    }
  }
}